

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlDOMWrapCloneNode(xmlDOMWrapCtxtPtr_conflict ctxt,xmlDocPtr sourceDoc,xmlNodePtr node,
                       xmlNodePtr *resNode,xmlDocPtr destDoc,xmlNodePtr destParent,int deep,
                       int options)

{
  xmlElementType xVar1;
  _xmlDict *p_Var2;
  _xmlNs **pp_Var3;
  xmlNodePtr pxVar4;
  int iVar5;
  _xmlNode *attr;
  xmlChar *name;
  xmlEntityPtr name_00;
  xmlNsPtr newNs;
  xmlNsMapItemPtr_conflict pxVar6;
  xmlChar *pxVar7;
  _xmlDoc *p_Var8;
  xmlNsMapItemPtr pxVar9;
  _xmlNode *p_Var10;
  xmlIDPtr pxVar11;
  long lVar12;
  _xmlNode *p_Var13;
  _xmlNode *p_Var14;
  xmlNsMapItemPtr pxVar15;
  xmlNodePtr pxVar16;
  char *extra;
  xmlNsPtr pxVar17;
  xmlNsPtr *retNs;
  _xmlNode *attr_00;
  int depth;
  xmlNsMapPtr nsMap;
  int in_stack_ffffffffffffff60;
  xmlNodePtr local_90;
  xmlNsMapItemPtr local_88;
  xmlNodePtr *local_80;
  xmlNsPtr local_78;
  ulong local_70;
  _xmlDoc *local_68;
  xmlNodePtr local_60;
  xmlNodePtr local_58;
  _xmlDict *local_50;
  xmlIDPtr local_48;
  xmlDOMWrapCtxtPtr local_40;
  _xmlDoc *local_38;
  
  local_88 = (xmlNsMapItemPtr_conflict)0x0;
  if (destDoc != (xmlDocPtr)0x0 && (resNode != (xmlNodePtr *)0x0 && node != (xmlNodePtr)0x0)) {
    if (node->type != XML_ELEMENT_NODE) {
      return 1;
    }
    p_Var8 = node->doc;
    if (((p_Var8 == sourceDoc) || (sourceDoc == (xmlDocPtr)0x0)) || (p_Var8 == (_xmlDoc *)0x0)) {
      if (sourceDoc != (xmlDocPtr)0x0) {
        p_Var8 = sourceDoc;
      }
      depth = -1;
      if (p_Var8 == (_xmlDoc *)0x0) {
        return -1;
      }
      if (ctxt != (xmlDOMWrapCtxtPtr_conflict)0x0) {
        local_88 = (xmlNsMapItemPtr)ctxt->namespaceMap;
      }
      p_Var2 = destDoc->dict;
      *resNode = (xmlNodePtr)0x0;
      if (node == (xmlNodePtr)0x0) {
        local_90 = (xmlNodePtr)0x0;
        depth = 0;
      }
      else {
        if (node->doc == p_Var8) {
          local_70 = 0;
          pxVar11 = (xmlIDPtr)&node->doc;
          local_60 = (xmlNodePtr)0x0;
          local_90 = (xmlNodePtr)0x0;
          pxVar16 = (xmlNodePtr)0x0;
          p_Var13 = (_xmlNode *)0x0;
          attr_00 = node;
          local_80 = resNode;
          local_68 = destDoc;
          local_58 = destParent;
          local_50 = p_Var2;
          local_38 = p_Var8;
LAB_001898be:
          xVar1 = attr_00->type;
          local_48 = pxVar11;
          if ((xVar1 - XML_TEXT_NODE < 6) || (xVar1 == XML_DOCUMENT_FRAG_NODE)) {
LAB_001898d4:
            attr = (_xmlNode *)(*xmlMalloc)(0x78);
            if (attr == (xmlNodePtr)0x0) {
              extra = "xmlDOMWrapCloneNode(): allocating a node";
LAB_00189fd0:
              __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,extra);
              goto switchD_00189a6c_caseD_9;
            }
            attr->nsDef = (xmlNs *)0x0;
            attr->psvi = (void *)0x0;
            attr->content = (xmlChar *)0x0;
            attr->properties = (_xmlAttr *)0x0;
            attr->doc = (_xmlDoc *)0x0;
            attr->ns = (xmlNs *)0x0;
            attr->next = (_xmlNode *)0x0;
            attr->prev = (_xmlNode *)0x0;
            attr->last = (_xmlNode *)0x0;
            attr->parent = (_xmlNode *)0x0;
            attr->name = (xmlChar *)0x0;
            attr->children = (_xmlNode *)0x0;
            attr->_private = (void *)0x0;
            *(undefined8 *)&attr->type = 0;
            attr->line = 0;
            attr->extra = 0;
            *(undefined4 *)&attr->field_0x74 = 0;
            pxVar4 = attr;
            if (local_90 != (xmlNodePtr)0x0) {
              attr->parent = p_Var13;
              if (pxVar16 != (xmlNodePtr)0x0) goto LAB_00189934;
              p_Var13->children = attr;
              pxVar4 = local_90;
            }
          }
          else {
            if (xVar1 != XML_ATTRIBUTE_NODE) {
              if (xVar1 == XML_ELEMENT_NODE) goto LAB_001898d4;
              goto switchD_00189a6c_caseD_9;
            }
            attr = (_xmlNode *)(*xmlRealloc)((void *)0x0,0x60);
            if (attr == (xmlNodePtr)0x0) {
              extra = "xmlDOMWrapCloneNode(): allocating an attr-node";
              goto LAB_00189fd0;
            }
            attr->content = (xmlChar *)0x0;
            attr->properties = (_xmlAttr *)0x0;
            attr->doc = (_xmlDoc *)0x0;
            attr->ns = (xmlNs *)0x0;
            attr->next = (_xmlNode *)0x0;
            attr->prev = (_xmlNode *)0x0;
            attr->last = (_xmlNode *)0x0;
            attr->parent = (_xmlNode *)0x0;
            attr->name = (xmlChar *)0x0;
            attr->children = (_xmlNode *)0x0;
            attr->_private = (void *)0x0;
            *(undefined8 *)&attr->type = 0;
            pxVar4 = attr;
            if (local_90 != (xmlNodePtr)0x0) {
              attr->parent = p_Var13;
              if (pxVar16 == (xmlNodePtr)0x0) {
                p_Var13->properties = (_xmlAttr *)attr;
                pxVar4 = local_90;
                goto LAB_001899c4;
              }
LAB_00189934:
              pxVar16->next = attr;
              attr->prev = pxVar16;
              pxVar4 = local_90;
            }
          }
LAB_001899c4:
          local_90 = pxVar4;
          p_Var2 = local_50;
          attr->type = attr_00->type;
          attr->doc = local_68;
          pxVar7 = attr_00->name;
          name = "text";
          if (((pxVar7 == "text") || (name = "textnoenc", pxVar7 == "textnoenc")) ||
             (name = "comment", pxVar7 == "comment")) {
LAB_00189a4b:
            attr->name = name;
          }
          else if (pxVar7 != (xmlChar *)0x0) {
            if (local_50 == (xmlDictPtr)0x0) {
              name = xmlStrdup(pxVar7);
            }
            else {
              iVar5 = xmlDictOwns(local_50,pxVar7);
              name = attr_00->name;
              if (iVar5 == 0) {
                name = xmlDictLookup(p_Var2,name,-1);
              }
            }
            goto LAB_00189a4b;
          }
          p_Var2 = local_50;
          switch(attr_00->type) {
          case XML_ELEMENT_NODE:
            goto switchD_00189a6c_caseD_1;
          case XML_ATTRIBUTE_NODE:
            goto switchD_00189a6c_caseD_2;
          case XML_TEXT_NODE:
          case XML_CDATA_SECTION_NODE:
          case XML_PI_NODE:
          case XML_COMMENT_NODE:
            pxVar7 = attr_00->content;
            if (pxVar7 == (xmlChar *)0x0) goto switchD_00189a6c_caseD_6;
            if (local_50 == (xmlDictPtr)0x0) {
              name_00 = (xmlEntityPtr)xmlStrdup(pxVar7);
            }
            else {
              iVar5 = xmlDictOwns(local_50,pxVar7);
              name_00 = (xmlEntityPtr)attr_00->content;
              lVar12 = 0x50;
              if (iVar5 != 0) goto LAB_00189c9c;
              name_00 = (xmlEntityPtr)xmlDictLookup(p_Var2,(xmlChar *)name_00,-1);
            }
            lVar12 = 0x50;
            goto LAB_00189c9c;
          case XML_ENTITY_REF_NODE:
            if (local_38 == local_68) {
              attr->content = attr_00->content;
              attr->children = attr_00->children;
              name_00 = (xmlEntityPtr)attr_00->last;
              lVar12 = 0x20;
            }
            else {
              if ((local_68->intSubset == (_xmlDtd *)0x0) && (local_68->extSubset == (_xmlDtd *)0x0)
                 ) goto switchD_00189a6c_caseD_6;
              name_00 = xmlGetDocEntity(local_68,attr_00->name);
              if (name_00 == (xmlEntityPtr)0x0) goto switchD_00189a6c_caseD_6;
              attr->content = name_00->content;
              attr->children = (_xmlNode *)name_00;
              lVar12 = 0x20;
            }
LAB_00189c9c:
            *(xmlEntityPtr *)((long)&attr->_private + lVar12) = name_00;
            goto switchD_00189a6c_caseD_6;
          case XML_ENTITY_NODE:
            goto switchD_00189a6c_caseD_6;
          default:
            goto switchD_00189a6c_caseD_9;
          case XML_XINCLUDE_START:
          case XML_XINCLUDE_END:
            goto switchD_00189a6c_caseD_13;
          }
        }
        local_90 = (xmlNodePtr)0x0;
      }
      goto LAB_00189ff3;
    }
  }
switchD_00189a6c_caseD_13:
  return -1;
switchD_00189a6c_caseD_1:
  depth = depth + 1;
  if (attr_00->nsDef != (xmlNs *)0x0) {
    iVar5 = (int)local_70;
    local_70 = (ulong)(iVar5 + (uint)(iVar5 == 0));
    if ((iVar5 == 0 && ctxt == (xmlDOMWrapCtxtPtr)0x0) && local_58 != (xmlNodePtr)0x0) {
      iVar5 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&local_88,local_58);
      local_70 = 1;
      if (iVar5 == -1) goto switchD_00189a6c_caseD_9;
    }
    local_78 = attr_00->nsDef;
    if (attr_00->nsDef != (xmlNsPtr)0x0) {
      pxVar17 = (xmlNsPtr)&attr->nsDef;
      local_40 = ctxt;
      do {
        newNs = (xmlNsPtr)(*xmlMalloc)(0x30);
        if (newNs == (xmlNsPtr)0x0) {
          __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,
                           "xmlDOMWrapCloneNode(): allocating namespace");
          return -1;
        }
        newNs->next = (_xmlNs *)0x0;
        *(undefined8 *)&newNs->type = 0;
        newNs->_private = (void *)0x0;
        newNs->context = (_xmlDoc *)0x0;
        newNs->href = (xmlChar *)0x0;
        newNs->prefix = (xmlChar *)0x0;
        newNs->type = XML_NAMESPACE_DECL;
        if (local_78->href != (xmlChar *)0x0) {
          pxVar7 = xmlStrdup(local_78->href);
          newNs->href = pxVar7;
        }
        if (local_78->prefix != (xmlChar *)0x0) {
          pxVar7 = xmlStrdup(local_78->prefix);
          newNs->prefix = pxVar7;
        }
        pxVar17->next = newNs;
        if ((local_40 == (xmlDOMWrapCtxtPtr)0x0) ||
           (local_40->getNsForNodeFunc == (xmlDOMWrapAcquireNsFunction)0x0)) {
          if (local_88 != (xmlNsMapItemPtr_conflict)0x0) {
            for (pxVar15 = local_88->next; pxVar15 != (xmlNsMapItemPtr)0x0; pxVar15 = pxVar15->next)
            {
              if ((-2 < pxVar15->depth) && (pxVar15->shadowDepth == -1)) {
                pxVar7 = pxVar15->newNs->prefix;
                if ((local_78->prefix == pxVar7) ||
                   (iVar5 = xmlStrEqual(local_78->prefix,pxVar7), iVar5 != 0)) {
                  pxVar15->shadowDepth = depth;
                }
              }
            }
          }
          pxVar6 = xmlDOMWrapNsMapAddItem((xmlNsMapPtr *)&local_88,-1,local_78,newNs,depth);
          ctxt = local_40;
          if (pxVar6 == (xmlNsMapItemPtr_conflict)0x0) goto LAB_0018a06c;
        }
        pp_Var3 = &local_78->next;
        local_78 = *pp_Var3;
        pxVar17 = newNs;
      } while (*pp_Var3 != (_xmlNs *)0x0);
      local_60 = attr_00;
      ctxt = local_40;
      goto switchD_00189a6c_caseD_2;
    }
  }
  local_60 = attr_00;
switchD_00189a6c_caseD_2:
  if (attr_00->ns != (xmlNs *)0x0) {
    iVar5 = (int)local_70;
    local_70 = (ulong)(iVar5 + (uint)(iVar5 == 0));
    if ((iVar5 == 0 && ctxt == (xmlDOMWrapCtxtPtr)0x0) && local_58 != (xmlNodePtr)0x0) {
      iVar5 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&local_88,local_58);
      local_70 = 1;
      if (iVar5 == -1) goto switchD_00189a6c_caseD_9;
    }
    if (local_88 != (xmlNsMapItemPtr_conflict)0x0) {
      for (pxVar15 = local_88->next; pxVar15 != (xmlNsMapItemPtr)0x0; pxVar15 = pxVar15->next) {
        if ((pxVar15->shadowDepth == -1) && (attr_00->ns == pxVar15->oldNs)) {
          retNs = &pxVar15->newNs;
          goto LAB_00189dd6;
        }
      }
    }
    if ((ctxt == (xmlDOMWrapCtxtPtr)0x0) ||
       (ctxt->getNsForNodeFunc == (xmlDOMWrapAcquireNsFunction)0x0)) {
      pxVar16 = local_60;
      if (local_58 == (xmlNodePtr)0x0) {
        pxVar16 = (xmlNodePtr)0x0;
      }
      retNs = &local_78;
      iVar5 = xmlDOMWrapNSNormAcquireNormalizedNs
                        (local_68,pxVar16,attr_00->ns,retNs,(xmlNsMapPtr *)&local_88,depth,
                         (uint)(attr_00->type == XML_ATTRIBUTE_NODE),in_stack_ffffffffffffff60);
      if (iVar5 == -1) goto switchD_00189a6c_caseD_9;
    }
    else {
      local_78 = (*ctxt->getNsForNodeFunc)(ctxt,attr_00,attr_00->ns->href,attr_00->ns->prefix);
      pxVar6 = xmlDOMWrapNsMapAddItem((xmlNsMapPtr *)&local_88,-1,attr_00->ns,local_78,-4);
      retNs = &local_78;
      if (pxVar6 == (xmlNsMapItemPtr_conflict)0x0) {
LAB_0018a06c:
        depth = -1;
        resNode = local_80;
        goto LAB_00189ff3;
      }
    }
LAB_00189dd6:
    attr->ns = *retNs;
  }
  if ((((attr->type == XML_ATTRIBUTE_NODE) && (attr->parent != (xmlNodePtr)0x0)) &&
      (iVar5 = xmlIsID(local_68,attr->parent,(xmlAttrPtr)attr), iVar5 != 0)) &&
     (pxVar7 = xmlNodeListGetString((xmlDocPtr)local_48->next,attr_00->children,1),
     pxVar7 != (xmlChar *)0x0)) {
    local_48 = xmlAddID((xmlValidCtxtPtr)0x0,local_68,pxVar7,(xmlAttrPtr)attr_00);
    (*xmlFree)(pxVar7);
    if (local_48 == (xmlIDPtr)0x0) goto switchD_00189a6c_caseD_9;
  }
  if ((attr_00->type != XML_ELEMENT_NODE) ||
     (p_Var10 = (_xmlNode *)attr_00->properties, p_Var14 = attr, p_Var10 == (_xmlNode *)0x0)) {
    for (; (p_Var10 = attr_00->children, p_Var10 == (_xmlNode *)0x0 ||
           ((p_Var14 = attr, deep == 0 && (attr_00->type != XML_ATTRIBUTE_NODE))));
        attr_00 = attr_00->parent) {
switchD_00189a6c_caseD_6:
      pxVar16 = attr;
      p_Var14 = p_Var13;
      while( true ) {
        if (attr_00 == node) {
          depth = 0;
          resNode = local_80;
          goto LAB_00189ff3;
        }
        xVar1 = attr_00->type;
        if ((xVar1 < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
           ((0x180002U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
          if ((local_88 != (xmlNsMapItemPtr)0x0) && (local_88->next != (xmlNsMapItemPtr)0x0)) {
            pxVar17 = (xmlNsPtr)local_88->prev;
            while ((pxVar6 = local_88, pxVar17 != (xmlNsPtr)0x0 &&
                   (depth <= *(int *)((long)&pxVar17->_private + 4)))) {
              pxVar15 = *(xmlNsMapItemPtr *)&pxVar17->type;
              local_88->prev = pxVar15;
              pxVar9 = local_88;
              if (pxVar15 != (xmlNsMapItemPtr)0x0) {
                pxVar9 = pxVar15;
              }
              pxVar9->next = (xmlNsMapItemPtr_conflict)0x0;
              pxVar17->next = local_88->oldNs;
              local_88->oldNs = pxVar17;
              pxVar17 = (xmlNsPtr)local_88->prev;
            }
            while (pxVar6 = pxVar6->next, pxVar6 != (xmlNsMapItemPtr_conflict)0x0) {
              if (depth <= pxVar6->shadowDepth) {
                pxVar6->shadowDepth = -1;
              }
            }
          }
          depth = depth + -1;
        }
        p_Var10 = attr_00->next;
        if (p_Var10 != (_xmlNode *)0x0) goto LAB_00189f9a;
        attr = pxVar16->parent;
        if (xVar1 == XML_ATTRIBUTE_NODE) break;
        if (attr != (_xmlNode *)0x0) {
          attr->last = pxVar16;
          p_Var14 = attr->parent;
        }
        attr_00 = attr_00->parent;
        pxVar16 = attr;
      }
      p_Var13 = attr->parent;
    }
  }
  pxVar16 = (xmlNodePtr)0x0;
LAB_00189f9a:
  pxVar11 = (xmlIDPtr)&p_Var10->doc;
  p_Var13 = p_Var14;
  attr_00 = p_Var10;
  if (p_Var10->doc != local_38) goto switchD_00189a6c_caseD_9;
  goto LAB_001898be;
switchD_00189a6c_caseD_9:
  depth = -1;
  resNode = local_80;
LAB_00189ff3:
  if (local_88 != (xmlNsMapItemPtr)0x0) {
    if ((ctxt == (xmlDOMWrapCtxtPtr)0x0) || ((xmlNsMapItemPtr)ctxt->namespaceMap != local_88)) {
      xmlDOMWrapNsMapFree((xmlNsMapPtr)local_88);
    }
    else if (local_88->next != (xmlNsMapItemPtr_conflict)0x0) {
      if ((xmlNsMapItemPtr_conflict)local_88->oldNs != (xmlNsMapItemPtr_conflict)0x0) {
        local_88->prev->next = (xmlNsMapItemPtr_conflict)local_88->oldNs;
      }
      local_88->oldNs = (xmlNsPtr)local_88->next;
      local_88->next = (xmlNsMapItemPtr_conflict)0x0;
    }
  }
  *resNode = local_90;
  return depth;
}

Assistant:

int
xmlDOMWrapCloneNode(xmlDOMWrapCtxtPtr ctxt,
		      xmlDocPtr sourceDoc,
		      xmlNodePtr node,
		      xmlNodePtr *resNode,
		      xmlDocPtr destDoc,
		      xmlNodePtr destParent,
		      int deep,
		      int options ATTRIBUTE_UNUSED)
{
    int ret = 0;
    xmlNodePtr cur, curElem = NULL;
    xmlNsMapPtr nsMap = NULL;
    xmlNsMapItemPtr mi;
    xmlNsPtr ns;
    int depth = -1;
    /* int adoptStr = 1; */
    /* gather @parent's ns-decls. */
    int parnsdone = 0;
    /*
    * @ancestorsOnly:
    * TODO: @ancestorsOnly should be set per option.
    *
    */
    int ancestorsOnly = 0;
    xmlNodePtr resultClone = NULL, clone = NULL, parentClone = NULL, prevClone = NULL;
    xmlNsPtr cloneNs = NULL, *cloneNsDefSlot = NULL;
    xmlDictPtr dict; /* The destination dict */

    if ((node == NULL) || (resNode == NULL) || (destDoc == NULL))
	return(-1);
    /*
    * TODO: Initially we support only element-nodes.
    */
    if (node->type != XML_ELEMENT_NODE)
	return(1);
    /*
    * Check node->doc sanity.
    */
    if ((node->doc != NULL) && (sourceDoc != NULL) &&
	(node->doc != sourceDoc)) {
	/*
	* Might be an XIncluded node.
	*/
	return (-1);
    }
    if (sourceDoc == NULL)
	sourceDoc = node->doc;
    if (sourceDoc == NULL)
        return (-1);

    dict = destDoc->dict;
    /*
    * Reuse the namespace map of the context.
    */
    if (ctxt)
	nsMap = (xmlNsMapPtr) ctxt->namespaceMap;

    *resNode = NULL;

    cur = node;
    if ((cur != NULL) && (cur->type == XML_NAMESPACE_DECL))
        return(-1);

    while (cur != NULL) {
	if (cur->doc != sourceDoc) {
	    /*
	    * We'll assume XIncluded nodes if the doc differs.
	    * TODO: Do we need to reconciliate XIncluded nodes?
	    * TODO: This here returns -1 in this case.
	    */
	    goto internal_error;
	}
	/*
	* Create a new node.
	*/
	switch (cur->type) {
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		/*
		* TODO: What to do with XInclude?
		*/
		goto internal_error;
		break;
	    case XML_ELEMENT_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
	    case XML_COMMENT_NODE:
	    case XML_PI_NODE:
	    case XML_DOCUMENT_FRAG_NODE:
	    case XML_ENTITY_REF_NODE:
	    case XML_ENTITY_NODE:
		/*
		* Nodes of xmlNode structure.
		*/
		clone = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
		if (clone == NULL) {
		    xmlTreeErrMemory("xmlDOMWrapCloneNode(): allocating a node");
		    goto internal_error;
		}
		memset(clone, 0, sizeof(xmlNode));
		/*
		* Set hierarchical links.
		*/
		if (resultClone != NULL) {
		    clone->parent = parentClone;
		    if (prevClone) {
			prevClone->next = clone;
			clone->prev = prevClone;
		    } else
			parentClone->children = clone;
		} else
		    resultClone = clone;

		break;
	    case XML_ATTRIBUTE_NODE:
		/*
		* Attributes (xmlAttr).
		*/
                /* Use xmlRealloc to avoid -Warray-bounds warning */
		clone = (xmlNodePtr) xmlRealloc(NULL, sizeof(xmlAttr));
		if (clone == NULL) {
		    xmlTreeErrMemory("xmlDOMWrapCloneNode(): allocating an attr-node");
		    goto internal_error;
		}
		memset(clone, 0, sizeof(xmlAttr));
		/*
		* Set hierarchical links.
		* TODO: Change this to add to the end of attributes.
		*/
		if (resultClone != NULL) {
		    clone->parent = parentClone;
		    if (prevClone) {
			prevClone->next = clone;
			clone->prev = prevClone;
		    } else
			parentClone->properties = (xmlAttrPtr) clone;
		} else
		    resultClone = clone;
		break;
	    default:
		/*
		* TODO QUESTION: Any other nodes expected?
		*/
		goto internal_error;
	}

	clone->type = cur->type;
	clone->doc = destDoc;

	/*
	* Clone the name of the node if any.
	*/
	if (cur->name == xmlStringText)
	    clone->name = xmlStringText;
	else if (cur->name == xmlStringTextNoenc)
	    /*
	    * NOTE: Although xmlStringTextNoenc is never assigned to a node
	    *   in tree.c, it might be set in Libxslt via
	    *   "xsl:disable-output-escaping".
	    */
	    clone->name = xmlStringTextNoenc;
	else if (cur->name == xmlStringComment)
	    clone->name = xmlStringComment;
	else if (cur->name != NULL) {
	    DICT_CONST_COPY(cur->name, clone->name);
	}

	switch (cur->type) {
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		/*
		* TODO
		*/
		return (-1);
	    case XML_ELEMENT_NODE:
		curElem = cur;
		depth++;
		/*
		* Namespace declarations.
		*/
		if (cur->nsDef != NULL) {
		    if (! parnsdone) {
			if (destParent && (ctxt == NULL)) {
			    /*
			    * Gather @parent's in-scope ns-decls.
			    */
			    if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
				destParent) == -1)
				goto internal_error;
			}
			parnsdone = 1;
		    }
		    /*
		    * Clone namespace declarations.
		    */
		    cloneNsDefSlot = &(clone->nsDef);
		    for (ns = cur->nsDef; ns != NULL; ns = ns->next) {
			/*
			* Create a new xmlNs.
			*/
			cloneNs = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
			if (cloneNs == NULL) {
			    xmlTreeErrMemory("xmlDOMWrapCloneNode(): "
				"allocating namespace");
			    return(-1);
			}
			memset(cloneNs, 0, sizeof(xmlNs));
			cloneNs->type = XML_LOCAL_NAMESPACE;

			if (ns->href != NULL)
			    cloneNs->href = xmlStrdup(ns->href);
			if (ns->prefix != NULL)
			    cloneNs->prefix = xmlStrdup(ns->prefix);

			*cloneNsDefSlot = cloneNs;
			cloneNsDefSlot = &(cloneNs->next);

			/*
			* Note that for custom handling of ns-references,
			* the ns-decls need not be stored in the ns-map,
			* since they won't be referenced by node->ns.
			*/
			if ((ctxt == NULL) ||
			    (ctxt->getNsForNodeFunc == NULL))
			{
			    /*
			    * Does it shadow any ns-decl?
			    */
			    if (XML_NSMAP_NOTEMPTY(nsMap)) {
				XML_NSMAP_FOREACH(nsMap, mi) {
				    if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
					(mi->shadowDepth == -1) &&
					((ns->prefix == mi->newNs->prefix) ||
					xmlStrEqual(ns->prefix,
					mi->newNs->prefix))) {
					/*
					* Mark as shadowed at the current
					* depth.
					*/
					mi->shadowDepth = depth;
				    }
				}
			    }
			    /*
			    * Push mapping.
			    */
			    if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
				ns, cloneNs, depth) == NULL)
				goto internal_error;
			}
		    }
		}
		/* cur->ns will be processed further down. */
		break;
	    case XML_ATTRIBUTE_NODE:
		/* IDs will be processed further down. */
		/* cur->ns will be processed further down. */
		break;
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
		/*
		* Note that this will also cover the values of attributes.
		*/
		DICT_COPY(cur->content, clone->content);
		goto leave_node;
	    case XML_ENTITY_NODE:
		/* TODO: What to do here? */
		goto leave_node;
	    case XML_ENTITY_REF_NODE:
		if (sourceDoc != destDoc) {
		    if ((destDoc->intSubset) || (destDoc->extSubset)) {
			xmlEntityPtr ent;
			/*
			* Different doc: Assign new entity-node if available.
			*/
			ent = xmlGetDocEntity(destDoc, cur->name);
			if (ent != NULL) {
			    clone->content = ent->content;
			    clone->children = (xmlNodePtr) ent;
			    clone->last = (xmlNodePtr) ent;
			}
		    }
		} else {
		    /*
		    * Same doc: Use the current node's entity declaration
		    * and value.
		    */
		    clone->content = cur->content;
		    clone->children = cur->children;
		    clone->last = cur->last;
		}
		goto leave_node;
	    case XML_PI_NODE:
		DICT_COPY(cur->content, clone->content);
		goto leave_node;
	    case XML_COMMENT_NODE:
		DICT_COPY(cur->content, clone->content);
		goto leave_node;
	    default:
		goto internal_error;
	}

	if (cur->ns == NULL)
	    goto end_ns_reference;

/* handle_ns_reference: */
	/*
	** The following will take care of references to ns-decls ********
	** and is intended only for element- and attribute-nodes.
	**
	*/
	if (! parnsdone) {
	    if (destParent && (ctxt == NULL)) {
		if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap, destParent) == -1)
		    goto internal_error;
	    }
	    parnsdone = 1;
	}
	/*
	* Adopt ns-references.
	*/
	if (XML_NSMAP_NOTEMPTY(nsMap)) {
	    /*
	    * Search for a mapping.
	    */
	    XML_NSMAP_FOREACH(nsMap, mi) {
		if ((mi->shadowDepth == -1) &&
		    (cur->ns == mi->oldNs)) {
		    /*
		    * This is the nice case: a mapping was found.
		    */
		    clone->ns = mi->newNs;
		    goto end_ns_reference;
		}
	    }
	}
	/*
	* No matching namespace in scope. We need a new one.
	*/
	if ((ctxt != NULL) && (ctxt->getNsForNodeFunc != NULL)) {
	    /*
	    * User-defined behaviour.
	    */
	    ns = ctxt->getNsForNodeFunc(ctxt, cur,
		cur->ns->href, cur->ns->prefix);
	    /*
	    * Add user's mapping.
	    */
	    if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
		cur->ns, ns, XML_TREE_NSMAP_CUSTOM) == NULL)
		goto internal_error;
	    clone->ns = ns;
	} else {
	    /*
	    * Acquire a normalized ns-decl and add it to the map.
	    */
	    if (xmlDOMWrapNSNormAcquireNormalizedNs(destDoc,
		/* ns-decls on curElem or on destDoc->oldNs */
		destParent ? curElem : NULL,
		cur->ns, &ns,
		&nsMap, depth,
		/* if we need to search only in the ancestor-axis */
		ancestorsOnly,
		/* ns-decls must be prefixed for attributes. */
		(cur->type == XML_ATTRIBUTE_NODE) ? 1 : 0) == -1)
		goto internal_error;
	    clone->ns = ns;
	}

end_ns_reference:

	/*
	* Some post-processing.
	*
	* Handle ID attributes.
	*/
	if ((clone->type == XML_ATTRIBUTE_NODE) &&
	    (clone->parent != NULL))
	{
	    if (xmlIsID(destDoc, clone->parent, (xmlAttrPtr) clone)) {

		xmlChar *idVal;

		idVal = xmlNodeListGetString(cur->doc, cur->children, 1);
		if (idVal != NULL) {
		    if (xmlAddID(NULL, destDoc, idVal, (xmlAttrPtr) cur) == NULL) {
			/* TODO: error message. */
			xmlFree(idVal);
			goto internal_error;
		    }
		    xmlFree(idVal);
		}
	    }
	}
	/*
	**
	** The following will traverse the tree **************************
	**
	*
	* Walk the element's attributes before descending into child-nodes.
	*/
	if ((cur->type == XML_ELEMENT_NODE) && (cur->properties != NULL)) {
	    prevClone = NULL;
	    parentClone = clone;
	    cur = (xmlNodePtr) cur->properties;
	    continue;
	}
into_content:
	/*
	* Descend into child-nodes.
	*/
	if (cur->children != NULL) {
	    if (deep || (cur->type == XML_ATTRIBUTE_NODE)) {
		prevClone = NULL;
		parentClone = clone;
		cur = cur->children;
		continue;
	    }
	}

leave_node:
	/*
	* At this point we are done with the node, its content
	* and an element-nodes's attribute-nodes.
	*/
	if (cur == node)
	    break;
	if ((cur->type == XML_ELEMENT_NODE) ||
	    (cur->type == XML_XINCLUDE_START) ||
	    (cur->type == XML_XINCLUDE_END)) {
	    /*
	    * TODO: Do we expect nsDefs on XML_XINCLUDE_START?
	    */
	    if (XML_NSMAP_NOTEMPTY(nsMap)) {
		/*
		* Pop mappings.
		*/
		while ((nsMap->last != NULL) &&
		    (nsMap->last->depth >= depth))
		{
		    XML_NSMAP_POP(nsMap, mi)
		}
		/*
		* Unshadow.
		*/
		XML_NSMAP_FOREACH(nsMap, mi) {
		    if (mi->shadowDepth >= depth)
			mi->shadowDepth = -1;
		}
	    }
	    depth--;
	}
	if (cur->next != NULL) {
	    prevClone = clone;
	    cur = cur->next;
	} else if (cur->type != XML_ATTRIBUTE_NODE) {
	    /*
	    * Set clone->last.
	    */
	    if (clone->parent != NULL)
		clone->parent->last = clone;
	    clone = clone->parent;
	    if (clone != NULL)
		parentClone = clone->parent;
	    /*
	    * Process parent --> next;
	    */
	    cur = cur->parent;
	    goto leave_node;
	} else {
	    /* This is for attributes only. */
	    clone = clone->parent;
	    parentClone = clone->parent;
	    /*
	    * Process parent-element --> children.
	    */
	    cur = cur->parent;
	    goto into_content;
	}
    }
    goto exit;

internal_error:
    ret = -1;

exit:
    /*
    * Cleanup.
    */
    if (nsMap != NULL) {
	if ((ctxt) && (ctxt->namespaceMap == nsMap)) {
	    /*
	    * Just cleanup the map but don't free.
	    */
	    if (nsMap->first) {
		if (nsMap->pool)
		    nsMap->last->next = nsMap->pool;
		nsMap->pool = nsMap->first;
		nsMap->first = NULL;
	    }
	} else
	    xmlDOMWrapNsMapFree(nsMap);
    }
    /*
    * TODO: Should we try a cleanup of the cloned node in case of a
    * fatal error?
    */
    *resNode = resultClone;
    return (ret);
}